

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

void __thiscall
QGraphicsScenePrivate::storeMouseButtonsForMouseGrabber
          (QGraphicsScenePrivate *this,QGraphicsSceneMouseEvent *event)

{
  Int IVar1;
  QGraphicsItem **ppQVar2;
  QGraphicsItemPrivate *in_RDI;
  long in_FS_OFFSET;
  int i;
  QGraphicsItemPrivate *in_stack_ffffffffffffff48;
  QPointF *in_stack_ffffffffffffff50;
  QWidget *in_stack_ffffffffffffff58;
  QPointF *in_stack_ffffffffffffff60;
  int local_74;
  QFlagsStorageHelper<Qt::MouseButton,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  for (local_74 = 1; local_74 < 0x11; local_74 = local_74 << 1) {
    QGraphicsSceneMouseEvent::buttons((QGraphicsSceneMouseEvent *)in_stack_ffffffffffffff50);
    local_c.super_QFlagsStorage<Qt::MouseButton>.i =
         (QFlagsStorage<Qt::MouseButton>)
         QFlags<Qt::MouseButton>::operator&
                   ((QFlags<Qt::MouseButton> *)in_stack_ffffffffffffff50,
                    (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
    IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_c);
    if (IVar1 != 0) {
      in_stack_ffffffffffffff50 = (QPointF *)(in_RDI[1].sceneTransform.m_matrix + 2);
      ppQVar2 = QList<QGraphicsItem_*>::constLast
                          ((QList<QGraphicsItem_*> *)in_stack_ffffffffffffff48);
      in_stack_ffffffffffffff48 =
           QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->(&(*ppQVar2)->d_ptr);
      QGraphicsSceneMouseEvent::scenePos((QGraphicsSceneMouseEvent *)in_stack_ffffffffffffff58);
      QGraphicsSceneEvent::widget((QGraphicsSceneEvent *)0x9c7162);
      QGraphicsItemPrivate::genericMapFromScene
                (in_RDI,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      QMap<Qt::MouseButton,_QPointF>::insert
                ((QMap<Qt::MouseButton,_QPointF> *)in_stack_ffffffffffffff60,
                 (MouseButton *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
      in_stack_ffffffffffffff58 = (QWidget *)(in_RDI[1].sceneTransform.m_matrix[2] + 1);
      QGraphicsSceneMouseEvent::scenePos((QGraphicsSceneMouseEvent *)in_stack_ffffffffffffff58);
      QMap<Qt::MouseButton,_QPointF>::insert
                ((QMap<Qt::MouseButton,_QPointF> *)in_stack_ffffffffffffff60,
                 (MouseButton *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
      in_stack_ffffffffffffff60 = (QPointF *)(in_RDI[1].sceneTransform.m_matrix[2] + 2);
      QGraphicsSceneMouseEvent::screenPos((QGraphicsSceneMouseEvent *)in_stack_ffffffffffffff50);
      QMap<Qt::MouseButton,_QPoint>::insert
                ((QMap<Qt::MouseButton,_QPoint> *)in_stack_ffffffffffffff60,
                 (MouseButton *)in_stack_ffffffffffffff58,(QPoint *)in_stack_ffffffffffffff50);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::storeMouseButtonsForMouseGrabber(QGraphicsSceneMouseEvent *event)
{
    for (int i = 0x1; i <= 0x10; i <<= 1) {
        if (event->buttons() & i) {
            mouseGrabberButtonDownPos.insert(Qt::MouseButton(i),
                                             mouseGrabberItems.constLast()->d_ptr->genericMapFromScene(event->scenePos(),
                                                                                                       event->widget()));
            mouseGrabberButtonDownScenePos.insert(Qt::MouseButton(i), event->scenePos());
            mouseGrabberButtonDownScreenPos.insert(Qt::MouseButton(i), event->screenPos());
        }
    }
}